

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Gia_ManSuperCollect(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  if (p->vSuper == (Vec_Int_t *)0x0) {
    pVVar2 = Vec_IntAlloc(100);
    p->vSuper = pVVar2;
  }
  else {
    Vec_IntClear(p->vSuper);
  }
  iVar1 = Gia_ObjIsXor(pObj);
  if (iVar1 != 0) {
    iVar1 = Gia_ObjFaninC0(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninC1(pObj);
      if (iVar1 == 0) {
        pGVar3 = Gia_ObjFanin0(pObj);
        Gia_ManSuperCollectXor_rec(p,pGVar3);
        pGVar3 = Gia_ObjFanin1(pObj);
        Gia_ManSuperCollectXor_rec(p,pGVar3);
        Vec_IntSort(p->vSuper,0);
        Gia_ManSimplifyXor(p->vSuper);
        goto LAB_00a0fe09;
      }
    }
    __assert_fail("!Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                  ,0x263,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar1 = Gia_ObjIsAndReal(p,pObj);
  if (iVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                  ,0x270,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
  }
  pGVar3 = Gia_ObjChild0(pObj);
  Gia_ManSuperCollectAnd_rec(p,pGVar3);
  pGVar3 = Gia_ObjChild1(pObj);
  Gia_ManSuperCollectAnd_rec(p,pGVar3);
  Vec_IntSort(p->vSuper,0);
  Gia_ManSimplifyAnd(p->vSuper);
LAB_00a0fe09:
  iVar1 = Vec_IntSize(p->vSuper);
  if (0 < iVar1) {
    return;
  }
  __assert_fail("Vec_IntSize(p->vSuper) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaStr.c"
                ,0x271,"void Gia_ManSuperCollect(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManSuperCollect( Gia_Man_t * p, Gia_Obj_t * pObj, int fStrict )
{
//    int nSize;
    if ( p->vSuper == NULL )
        p->vSuper = Vec_IntAlloc( 1000 );
    else
        Vec_IntClear( p->vSuper );
    if ( Gia_ObjIsXor(pObj) )
    {
        assert( !Gia_ObjFaninC0(pObj) && !Gia_ObjFaninC1(pObj) );
        Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin0(pObj), fStrict );
        Gia_ManSuperCollectXor_rec( p, Gia_ObjFanin1(pObj), fStrict );
//        nSize = Vec_IntSize(vSuper);
        Vec_IntSort( p->vSuper, 0 );
        Gia_ManSimplifyXor( p->vSuper );
//        if ( nSize != Vec_IntSize(vSuper) )
//            printf( "X %d->%d  ", nSize, Vec_IntSize(vSuper) );
    }
    else if ( Gia_ObjIsAndReal(p, pObj) )
    {
        Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild0(pObj), fStrict );
        Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild1(pObj), fStrict );
//        nSize = Vec_IntSize(vSuper);
        Vec_IntSort( p->vSuper, 0 );
        Gia_ManSimplifyAnd( p->vSuper );
//        if ( nSize != Vec_IntSize(vSuper) )
//            printf( "A %d->%d  ", nSize, Vec_IntSize(vSuper) );
    }
    else assert( 0 );
//    if ( nSize > 10 )
//        printf( "%d ", nSize );
    assert( Vec_IntSize(p->vSuper) > 0 );
}